

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O3

ASDCP * __thiscall
ASDCP::MD_to_JP2K_PDesc
          (ASDCP *this,GenericPictureEssenceDescriptor *EssenceDescriptor,
          JPEG2000PictureSubDescriptor *EssenceSubDescriptor,Rational *EditRate,Rational *SampleRate
          ,PictureDescriptor *PDesc)

{
  uint uVar1;
  void *pvVar2;
  pointer pAVar3;
  CodingStyleDefault_t *pCVar4;
  ui32_t uVar5;
  ui32_t uVar6;
  ui32_t uVar7;
  ILogSink *this_00;
  long lVar8;
  ulong uVar9;
  
  memset(PDesc,0,0x1d8);
  PDesc->EditRate = *EditRate;
  PDesc->SampleRate = *SampleRate;
  if ((EssenceDescriptor->super_FileDescriptor).ContainerDuration.m_has_value == true) {
    uVar9 = (EssenceDescriptor->super_FileDescriptor).ContainerDuration.m_property;
    if (uVar9 >> 0x20 != 0) {
      __assert_fail("EssenceDescriptor.ContainerDuration.const_get() <= 0xFFFFFFFFL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_JP2K.cpp"
                    ,0x194,
                    "ASDCP::Result_t ASDCP::MD_to_JP2K_PDesc(const ASDCP::MXF::GenericPictureEssenceDescriptor &, const ASDCP::MXF::JPEG2000PictureSubDescriptor &, const ASDCP::Rational &, const ASDCP::Rational &, ASDCP::JP2K::PictureDescriptor &)"
                   );
    }
    PDesc->ContainerDuration = (ui32_t)uVar9;
  }
  uVar5 = EssenceDescriptor->StoredHeight;
  PDesc->StoredWidth = EssenceDescriptor->StoredWidth;
  PDesc->StoredHeight = uVar5;
  PDesc->AspectRatio = (EssenceDescriptor->AspectRatio).super_Rational;
  PDesc->Rsize = EssenceSubDescriptor->Rsize;
  uVar5 = EssenceSubDescriptor->Ysize;
  uVar6 = EssenceSubDescriptor->XOsize;
  uVar7 = EssenceSubDescriptor->YOsize;
  PDesc->Xsize = EssenceSubDescriptor->Xsize;
  PDesc->Ysize = uVar5;
  PDesc->XOsize = uVar6;
  PDesc->YOsize = uVar7;
  uVar5 = EssenceSubDescriptor->YTsize;
  uVar6 = EssenceSubDescriptor->XTOsize;
  uVar7 = EssenceSubDescriptor->YTOsize;
  PDesc->XTsize = EssenceSubDescriptor->XTsize;
  PDesc->YTsize = uVar5;
  PDesc->XTOsize = uVar6;
  PDesc->YTOsize = uVar7;
  PDesc->Csize = EssenceSubDescriptor->Csize;
  uVar1 = *(uint *)&(EssenceSubDescriptor->PictureComponentSizing).m_property.field_0x14;
  if (uVar1 == 0x11) {
    lVar8 = *(long *)&(EssenceSubDescriptor->PictureComponentSizing).m_property.field_0x8;
    if (lVar8 == 0) goto LAB_001d8405;
    PDesc->ImageComponents[2].YRsize = *(ui8_t *)(lVar8 + 0x10);
    *(undefined8 *)PDesc->ImageComponents = *(undefined8 *)(lVar8 + 8);
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Warn
              (this_00,"Unexpected PictureComponentSizing size: %u, should be 17.\n",(ulong)uVar1);
  }
  pCVar4 = &PDesc->CodingStyleDefault;
  (pCVar4->SPcod).PrecinctSize[0x10] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x11] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x12] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x13] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x14] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x15] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x16] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x17] = '\0';
  pCVar4 = &PDesc->CodingStyleDefault;
  (pCVar4->SPcod).PrecinctSize[0x18] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x19] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x1a] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x1b] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x1c] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x1d] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x1e] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x1f] = '\0';
  pCVar4 = &PDesc->CodingStyleDefault;
  (pCVar4->SPcod).PrecinctSize[6] = '\0';
  (pCVar4->SPcod).PrecinctSize[7] = '\0';
  (pCVar4->SPcod).PrecinctSize[8] = '\0';
  (pCVar4->SPcod).PrecinctSize[9] = '\0';
  (pCVar4->SPcod).PrecinctSize[10] = '\0';
  (pCVar4->SPcod).PrecinctSize[0xb] = '\0';
  (pCVar4->SPcod).PrecinctSize[0xc] = '\0';
  (pCVar4->SPcod).PrecinctSize[0xd] = '\0';
  pCVar4 = &PDesc->CodingStyleDefault;
  (pCVar4->SPcod).PrecinctSize[0xe] = '\0';
  (pCVar4->SPcod).PrecinctSize[0xf] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x10] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x11] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x12] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x13] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x14] = '\0';
  (pCVar4->SPcod).PrecinctSize[0x15] = '\0';
  (PDesc->CodingStyleDefault).Scod = '\0';
  (PDesc->CodingStyleDefault).SGcod.ProgressionOrder = '\0';
  (PDesc->CodingStyleDefault).SGcod.NumberOfLayers[0] = '\0';
  (PDesc->CodingStyleDefault).SGcod.NumberOfLayers[1] = '\0';
  (PDesc->CodingStyleDefault).SGcod.MultiCompTransform = '\0';
  (PDesc->CodingStyleDefault).SPcod.DecompositionLevels = '\0';
  (PDesc->CodingStyleDefault).SPcod.CodeblockWidth = '\0';
  (PDesc->CodingStyleDefault).SPcod.CodeblockHeight = '\0';
  (PDesc->CodingStyleDefault).SPcod.CodeblockStyle = '\0';
  (PDesc->CodingStyleDefault).SPcod.Transformation = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[0] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[1] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[2] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[3] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[4] = '\0';
  (PDesc->CodingStyleDefault).SPcod.PrecinctSize[5] = '\0';
  pvVar2 = *(void **)&(EssenceSubDescriptor->CodingStyleDefault).m_property.field_0x8;
  if (pvVar2 == (void *)0x0) {
LAB_001d8405:
    __assert_fail("m_Data",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                  ,0x221,"const byte_t *Kumu::ByteString::RoData() const");
  }
  memcpy(&PDesc->CodingStyleDefault,pvVar2,
         (ulong)*(uint *)&(EssenceSubDescriptor->CodingStyleDefault).m_property.field_0x14);
  memset(&PDesc->QuantizationDefault,0,0x102);
  pvVar2 = *(void **)&(EssenceSubDescriptor->QuantizationDefault).m_property.field_0x8;
  if (pvVar2 == (void *)0x0) goto LAB_001d8405;
  memcpy(&PDesc->QuantizationDefault,pvVar2,
         (ulong)*(uint *)&(EssenceSubDescriptor->QuantizationDefault).m_property.field_0x14);
  (PDesc->QuantizationDefault).SPqcdLength =
       (EssenceSubDescriptor->QuantizationDefault).m_property.field_0x14 + 0xff;
  (PDesc->Profile).Pprf[0] = 0;
  (PDesc->Profile).Pprf[1] = 0;
  (PDesc->Profile).Pprf[2] = 0;
  (PDesc->Profile).Pprf[3] = 0;
  if ((EssenceSubDescriptor->J2KProfile).m_has_value == true) {
    pAVar3 = (EssenceSubDescriptor->J2KProfile).m_property.
             super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
             .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
             super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar8 = (long)*(pointer *)
                   ((long)&(EssenceSubDescriptor->J2KProfile).m_property.
                           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                           .
                           super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                           .
                           super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                           ._M_impl.super__Vector_impl_data + 8) - (long)pAVar3;
    if (lVar8 == 0) goto LAB_001d82e1;
    lVar8 = lVar8 >> 4;
    (PDesc->Profile).N = (ui16_t)lVar8;
    if (0 < lVar8) {
      uVar9 = lVar8 + 1;
      lVar8 = 0;
      do {
        *(ui16_t *)((long)(PDesc->Profile).Pprf + lVar8) = (&pAVar3->value)[lVar8 * 4];
        uVar9 = uVar9 - 1;
        lVar8 = lVar8 + 2;
      } while (1 < uVar9);
    }
  }
  else {
LAB_001d82e1:
    (PDesc->Profile).N = 0;
  }
  (PDesc->CorrespondingProfile).Pcpf[0] = 0;
  (PDesc->CorrespondingProfile).Pcpf[1] = 0;
  (PDesc->CorrespondingProfile).Pcpf[2] = 0;
  (PDesc->CorrespondingProfile).Pcpf[3] = 0;
  if ((EssenceSubDescriptor->J2KCorrespondingProfile).m_has_value == true) {
    pAVar3 = (EssenceSubDescriptor->J2KCorrespondingProfile).m_property.
             super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
             .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
             super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar8 = (long)*(pointer *)
                   ((long)&(EssenceSubDescriptor->J2KCorrespondingProfile).m_property.
                           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                           .
                           super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                           .
                           super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                           ._M_impl.super__Vector_impl_data + 8) - (long)pAVar3;
    if (lVar8 != 0) {
      lVar8 = lVar8 >> 4;
      (PDesc->CorrespondingProfile).N = (ui16_t)lVar8;
      if (0 < lVar8) {
        uVar9 = lVar8 + 1;
        lVar8 = 0;
        do {
          *(ui16_t *)((long)(PDesc->CorrespondingProfile).Pcpf + lVar8) =
               (&pAVar3->value)[lVar8 * 4];
          uVar9 = uVar9 - 1;
          lVar8 = lVar8 + 2;
        } while (1 < uVar9);
      }
      goto LAB_001d8350;
    }
  }
  (PDesc->CorrespondingProfile).N = 0;
LAB_001d8350:
  (PDesc->ExtendedCapabilities).Ccap[0x18] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x19] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x1a] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x1b] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x1c] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x1d] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x1e] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x1f] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x10] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x11] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x12] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x13] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x14] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x15] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x16] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0x17] = 0;
  (PDesc->ExtendedCapabilities).Ccap[8] = 0;
  (PDesc->ExtendedCapabilities).Ccap[9] = 0;
  (PDesc->ExtendedCapabilities).Ccap[10] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0xb] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0xc] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0xd] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0xe] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0xf] = 0;
  (PDesc->ExtendedCapabilities).Ccap[0] = 0;
  (PDesc->ExtendedCapabilities).Ccap[1] = 0;
  (PDesc->ExtendedCapabilities).Ccap[2] = 0;
  (PDesc->ExtendedCapabilities).Ccap[3] = 0;
  (PDesc->ExtendedCapabilities).Ccap[4] = 0;
  (PDesc->ExtendedCapabilities).Ccap[5] = 0;
  (PDesc->ExtendedCapabilities).Ccap[6] = 0;
  (PDesc->ExtendedCapabilities).Ccap[7] = 0;
  if ((EssenceSubDescriptor->J2KExtendedCapabilities).m_has_value == false) {
    (PDesc->ExtendedCapabilities).Pcap = 0;
    (PDesc->ExtendedCapabilities).N = -1;
  }
  else {
    (PDesc->ExtendedCapabilities).Pcap =
         (EssenceSubDescriptor->J2KExtendedCapabilities).m_property.Pcap;
    pAVar3 = (EssenceSubDescriptor->J2KExtendedCapabilities).m_property.Ccap.
             super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
             .super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>.
             super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>._M_impl
             .super__Vector_impl_data._M_start;
    lVar8 = (long)*(pointer *)
                   ((long)&(EssenceSubDescriptor->J2KExtendedCapabilities).m_property.Ccap.
                           super_FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                           .
                           super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                           .
                           super__Vector_base<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                           ._M_impl + 8) - (long)pAVar3 >> 4;
    (PDesc->ExtendedCapabilities).N = (i8_t)lVar8;
    if (0 < lVar8) {
      uVar9 = lVar8 + 1;
      lVar8 = 0;
      do {
        *(ui16_t *)((long)(PDesc->ExtendedCapabilities).Ccap + lVar8) = (&pAVar3->value)[lVar8 * 4];
        uVar9 = uVar9 - 1;
        lVar8 = lVar8 + 2;
      } while (1 < uVar9);
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MD_to_JP2K_PDesc(const ASDCP::MXF::GenericPictureEssenceDescriptor&  EssenceDescriptor,
			const ASDCP::MXF::JPEG2000PictureSubDescriptor& EssenceSubDescriptor,
			const ASDCP::Rational& EditRate, const ASDCP::Rational& SampleRate,
			ASDCP::JP2K::PictureDescriptor& PDesc)
{
  memset(&PDesc, 0, sizeof(PDesc));

  PDesc.EditRate           = EditRate;
  PDesc.SampleRate         = SampleRate;
  if ( ! EssenceDescriptor.ContainerDuration.empty() )
    {
      assert(EssenceDescriptor.ContainerDuration.const_get() <= 0xFFFFFFFFL);
      PDesc.ContainerDuration  = static_cast<ui32_t>(EssenceDescriptor.ContainerDuration.const_get());
    }
  PDesc.StoredWidth        = EssenceDescriptor.StoredWidth;
  PDesc.StoredHeight       = EssenceDescriptor.StoredHeight;
  PDesc.AspectRatio        = EssenceDescriptor.AspectRatio;

  PDesc.Rsize   = EssenceSubDescriptor.Rsize;
  PDesc.Xsize   = EssenceSubDescriptor.Xsize;
  PDesc.Ysize   = EssenceSubDescriptor.Ysize;
  PDesc.XOsize  = EssenceSubDescriptor.XOsize;
  PDesc.YOsize  = EssenceSubDescriptor.YOsize;
  PDesc.XTsize  = EssenceSubDescriptor.XTsize;
  PDesc.YTsize  = EssenceSubDescriptor.YTsize;
  PDesc.XTOsize = EssenceSubDescriptor.XTOsize;
  PDesc.YTOsize = EssenceSubDescriptor.YTOsize;
  PDesc.Csize   = EssenceSubDescriptor.Csize;

  // PictureComponentSizing
  ui32_t tmp_size = EssenceSubDescriptor.PictureComponentSizing.const_get().Length();

  if ( tmp_size == 17 ) // ( 2 * sizeof(ui32_t) ) + 3 components * 3 byte each
    {
      memcpy(&PDesc.ImageComponents, EssenceSubDescriptor.PictureComponentSizing.const_get().RoData() + 8, tmp_size - 8);
    }
  else
    {
      DefaultLogSink().Warn("Unexpected PictureComponentSizing size: %u, should be 17.\n", tmp_size);
    }

  // CodingStyleDefault
  memset(&PDesc.CodingStyleDefault, 0, sizeof(CodingStyleDefault_t));
  memcpy(&PDesc.CodingStyleDefault,
	 EssenceSubDescriptor.CodingStyleDefault.const_get().RoData(),
	 EssenceSubDescriptor.CodingStyleDefault.const_get().Length());

  // QuantizationDefault
  memset(&PDesc.QuantizationDefault, 0, sizeof(QuantizationDefault_t));
  memcpy(&PDesc.QuantizationDefault,
	 EssenceSubDescriptor.QuantizationDefault.const_get().RoData(),
	 EssenceSubDescriptor.QuantizationDefault.const_get().Length());
  
  PDesc.QuantizationDefault.SPqcdLength = EssenceSubDescriptor.QuantizationDefault.const_get().Length() - 1;

  // Profile

  std::fill(PDesc.Profile.Pprf, PDesc.Profile.Pprf + JP2K::MaxPRFN, 0);

  if (EssenceSubDescriptor.J2KProfile.empty() ||
	  EssenceSubDescriptor.J2KProfile.const_get().size() == 0) {

	  PDesc.Profile.N = 0;

  } else {

	  PDesc.Profile.N = EssenceSubDescriptor.J2KProfile.const_get().size();

	  std::copy(EssenceSubDescriptor.J2KProfile.const_get().begin(),
		  EssenceSubDescriptor.J2KProfile.const_get().end(),
		  PDesc.Profile.Pprf);

  }

  // Corresponding profile

  std::fill(PDesc.CorrespondingProfile.Pcpf, PDesc.CorrespondingProfile.Pcpf + JP2K::MaxCPFN, 0);

  if (EssenceSubDescriptor.J2KCorrespondingProfile.empty() ||
	  EssenceSubDescriptor.J2KCorrespondingProfile.const_get().size() == 0) {

	  PDesc.CorrespondingProfile.N = 0;

  }
  else {

	  PDesc.CorrespondingProfile.N = EssenceSubDescriptor.J2KCorrespondingProfile.const_get().size();

	  std::copy(EssenceSubDescriptor.J2KCorrespondingProfile.const_get().begin(),
		  EssenceSubDescriptor.J2KCorrespondingProfile.const_get().end(),
		  PDesc.CorrespondingProfile.Pcpf);

  }

  // Extended capabilities

  std::fill(PDesc.ExtendedCapabilities.Ccap, PDesc.ExtendedCapabilities.Ccap + JP2K::MaxCapabilities, 0);

  if (EssenceSubDescriptor.J2KExtendedCapabilities.empty()) {

	  PDesc.ExtendedCapabilities.Pcap = 0;
	  PDesc.ExtendedCapabilities.N = JP2K::NoExtendedCapabilitiesSignaled;

  }
  else {

	  PDesc.ExtendedCapabilities.Pcap = EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Pcap;
	  PDesc.ExtendedCapabilities.N = EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Ccap.size();

	  std::copy(EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Ccap.begin(),
		  EssenceSubDescriptor.J2KExtendedCapabilities.const_get().Ccap.end(),
		  PDesc.ExtendedCapabilities.Ccap);

  }

  return RESULT_OK;
}